

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3Incrmerge(Fts3Table *p,int nMerge,int nMin)

{
  i64 *pnByte;
  Blob *pBlob;
  sqlite3_stmt *psVar1;
  char cVar2;
  uint uVar3;
  byte bVar4;
  sqlite3_stmt *pStmt;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  int *piVar9;
  Mem *pMVar10;
  void *pvVar11;
  Blob *pBVar12;
  char *pcVar13;
  i64 iVar14;
  sqlite3_int64 sVar15;
  void *pvVar16;
  sqlite3_stmt *psVar17;
  Vdbe *p_2;
  int *piVar18;
  Fts3SegReader *pSeg;
  ulong *puVar19;
  int iVar20;
  uint uVar21;
  Fts3Table *pFVar22;
  long lVar23;
  ulong uVar24;
  u64 uVar25;
  uint uVar32;
  Fts3SegReader **__s;
  ulong *puVar26;
  int *in_R8;
  int *piVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  char *pcVar31;
  int iVar33;
  Vdbe *p_1;
  ulong uVar34;
  long lVar35;
  Fts3MultiSegReader *pCsr;
  bool bVar36;
  int local_18c;
  char *aBlock_1;
  Fts3Table *local_180;
  ulong *local_178;
  char *local_170;
  undefined8 local_168;
  sqlite3_stmt *local_160;
  int nLeaf;
  int *local_150;
  int rc;
  undefined4 uStack_144;
  undefined8 uStack_140;
  Blob *local_138;
  ulong local_130;
  ulong local_128;
  char *aLeaf;
  sqlite3_stmt *pSelect;
  undefined8 uStack_110;
  ulong local_108;
  char *local_100;
  int local_f8;
  char *local_d8;
  Fts3MultiSegReader *local_d0;
  sqlite3_int64 iEnd;
  int local_c0;
  int local_bc;
  Blob hint;
  sqlite3_stmt *pFindLevel;
  size_t local_78;
  int *local_70;
  Blob *pBlock;
  Blob *local_60;
  Blob *local_58;
  int *local_50;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  hint.a = (char *)0x0;
  hint.n = 0;
  hint.nAlloc = 0;
  local_bc = nMerge;
  iVar5 = sqlite3_initialize();
  if (iVar5 == 0) {
    piVar9 = (int *)sqlite3Malloc(0x328);
  }
  else {
    piVar9 = (int *)0x0;
  }
  if (piVar9 == (int *)0x0) {
    local_18c = 7;
  }
  else {
    pSelect = (sqlite3_stmt *)0x0;
    hint._8_8_ = hint._8_8_ & 0xffffffff00000000;
    iVar5 = fts3SqlStmt(p,0x16,&pSelect,(sqlite3_value **)0x0);
    psVar17 = pSelect;
    _rc = (sqlite3_stmt *)CONCAT44(uStack_144,iVar5);
    local_180 = p;
    if (iVar5 == 0) {
      sqlite3_bind_int64(pSelect,1,1);
      iVar5 = sqlite3_step(psVar17);
      if (iVar5 == 100) {
        pMVar10 = columnMem(psVar17,0);
        pvVar11 = sqlite3_value_blob(pMVar10);
        columnMallocFailure(psVar17);
        iVar5 = sqlite3_column_bytes(psVar17,0);
        if (pvVar11 != (void *)0x0) {
          blobGrowBuffer(&hint,iVar5,&rc);
          if (rc == 0) {
            memcpy(hint.a,pvVar11,(long)iVar5);
            hint.n = iVar5;
          }
        }
      }
      iVar5 = sqlite3_reset(psVar17);
      if (rc != 0) {
        iVar5 = rc;
      }
      _rc = (sqlite3_stmt *)CONCAT44(uStack_144,iVar5);
    }
    local_40 = piVar9 + 0xae;
    local_d0 = (Fts3MultiSegReader *)(piVar9 + 0xb4);
    local_18c = rc;
    if (nMin < 3) {
      nMin = 2;
    }
    local_38 = (ulong)(uint)nMin;
    pnByte = (i64 *)(piVar9 + 10);
    puVar19 = (ulong *)(piVar9 + 0xe);
    local_58 = (Blob *)(piVar9 + 0x10);
    pBlob = (Blob *)(piVar9 + 0x14);
    pBlock = (Blob *)(piVar9 + 0x1e);
    local_70 = piVar9 + 0x18;
    local_c0 = 0;
    local_160 = (sqlite3_stmt *)0x0;
    pFVar22 = local_180;
    local_178 = puVar19;
    local_150 = piVar9;
    do {
      if ((local_18c != 0) || (local_bc < 1)) break;
      iVar5 = pFVar22->nIndex;
      pFindLevel = (sqlite3_stmt *)0x0;
      local_18c = fts3SqlStmt(pFVar22,0x1c,&pFindLevel,(sqlite3_value **)0x0);
      psVar17 = pFindLevel;
      sqlite3_bind_int64(pFindLevel,1,local_38);
      iVar6 = sqlite3_step(psVar17);
      uVar30 = 0xffffffff;
      if (iVar6 == 100) {
        pMVar10 = columnMem(psVar17,0);
        local_160 = (sqlite3_stmt *)sqlite3VdbeIntValue(pMVar10);
        columnMallocFailure(psVar17);
        pMVar10 = columnMem(psVar17,1);
        uVar30 = sqlite3VdbeIntValue(pMVar10);
        columnMallocFailure(psVar17);
      }
      local_18c = sqlite3_reset(psVar17);
      pcVar31 = hint.a;
      iVar6 = hint.n;
      if (hint.n == 0 || local_18c != 0) {
        uVar7 = 0;
      }
      else {
        pSelect = (sqlite3_stmt *)0x0;
        _rc = (sqlite3_stmt *)((ulong)_rc & 0xffffffff00000000);
        uVar34 = (ulong)(hint.n - 2);
        if (2 < hint.n) {
          do {
            iVar29 = (int)uVar34;
            if (-1 < hint.a[uVar34 - 1]) goto LAB_001c2d70;
            uVar34 = (ulong)(iVar29 - 1);
          } while (1 < iVar29);
          uVar34 = 0;
        }
LAB_001c2d70:
        iVar29 = (int)uVar34;
        if (0 < iVar29) {
          do {
            iVar29 = (int)uVar34;
            if (-1 < hint.a[uVar34 - 1]) goto LAB_001c2dae;
            uVar34 = (ulong)(iVar29 - 1);
          } while (1 < iVar29);
          iVar29 = 0;
        }
LAB_001c2dae:
        hint.n = iVar29;
        iVar8 = sqlite3Fts3GetVarint(hint.a + iVar29,(sqlite_int64 *)&pSelect);
        iVar29 = iVar29 + iVar8;
        cVar2 = pcVar31[iVar29];
        if (cVar2 < '\0') {
          iVar8 = sqlite3Fts3GetVarint32(pcVar31 + iVar29,&rc);
        }
        else {
          _rc = (sqlite3_stmt *)CONCAT44(uStack_144,(int)cVar2);
          iVar8 = 1;
        }
        local_18c = 0x10b;
        if (iVar8 + iVar29 == iVar6) {
          local_18c = 0;
        }
        puVar19 = local_178;
        piVar9 = local_150;
        if (((int)uVar30 < 0) ||
           (lVar35 = (long)iVar5 << 10, (long)pSelect % lVar35 <= (long)local_160 % lVar35)) {
          local_160 = pSelect;
          uVar7 = (undefined4)CONCAT71((int7)((ulong)pSelect >> 8),1);
          local_c0 = 1;
          uVar30 = (ulong)_rc & 0xffffffff;
        }
        else {
          hint._8_8_ = CONCAT44(hint.nAlloc,iVar6);
          uVar7 = 0;
        }
      }
      pCsr = local_d0;
      if (-1 < (int)uVar30) {
        local_130 = CONCAT44(local_130._4_4_,uVar7);
        memset(piVar9,0,0x328);
        piVar9[0xb2] = 1;
        pBVar12 = (Blob *)0x0;
        iVar5 = local_18c;
        if (local_18c == 0) {
          pSelect = (sqlite3_stmt *)0x0;
          pBVar12 = (Blob *)0x0;
          iVar5 = fts3SqlStmt(pFVar22,8,&pSelect,(sqlite3_value **)0x0);
          psVar17 = pSelect;
          if (iVar5 == 0) {
            sqlite3_bind_int64(pSelect,1,(sqlite_int64)(local_160 + 1));
            sqlite3_step(psVar17);
            pMVar10 = columnMem(psVar17,0);
            pBVar12 = (Blob *)sqlite3VdbeIntValue(pMVar10);
            columnMallocFailure(psVar17);
            puVar19 = local_178;
            iVar5 = sqlite3_reset(psVar17);
          }
          if ((((int)pBVar12 != 0 & ((byte)local_130 ^ 1 | (int)pBVar12 != 1)) == 0) &&
             (local_18c = iVar5, iVar5 = fts3SqlStmt(pFVar22,0xf,&pSelect,(sqlite3_value **)0x0),
             pStmt = pSelect, psVar17 = local_160, iVar5 == 0)) {
            psVar1 = local_160 + 1;
            local_138 = pBVar12;
            local_128 = uVar30;
            sqlite3_bind_int64(pSelect,1,(sqlite_int64)(local_160 + 2));
            psVar17 = psVar17 + 0x400;
            if (-1 < (long)psVar1) {
              psVar17 = psVar1;
            }
            sqlite3_bind_int64(pStmt,2,((ulong)psVar17 & 0xfffffffffffffc00) + 0x400);
            iVar5 = sqlite3_step(pStmt);
            if (iVar5 == 100) {
              pMVar10 = columnMem(pStmt,0);
              uVar32._0_2_ = pMVar10->flags;
              uVar32._2_1_ = pMVar10->enc;
              uVar32._3_1_ = pMVar10->eSubtype;
              columnMallocFailure(pStmt);
              iVar5 = sqlite3_reset(pStmt);
              puVar19 = local_178;
              pFVar22 = local_180;
              uVar30 = local_128;
              pBVar12 = local_138;
              if ((0xaaaaaaaaU >> (uVar32 & 0x1f) & 1) != 0) {
                *(byte *)(piVar9 + 0xb2) = *(byte *)(piVar9 + 0xb2) | 2;
              }
            }
            else {
              iVar5 = sqlite3_reset(pStmt);
              puVar19 = local_178;
              uVar30 = local_128;
              pBVar12 = local_138;
            }
          }
        }
        local_18c = iVar5;
        iVar5 = local_18c;
        if (local_18c == 0) {
          pSelect = (sqlite3_stmt *)0x0;
          *(undefined8 *)&pCsr->nDoclist = 0;
          *(undefined8 *)&pCsr->nTerm = 0;
          pCsr->aDoclist = (char *)0x0;
          *(undefined8 *)&pCsr->bLookup = 0;
          pCsr->zTerm = (char *)0x0;
          pCsr->nBuffer = 0;
          pCsr->iColFilter = 0;
          pCsr->bRestart = 0;
          pCsr->nCost = 0;
          pCsr->pFilter = (Fts3SegFilter *)0x0;
          pCsr->aBuffer = (char *)0x0;
          pCsr->apSegment = (Fts3SegReader **)0x0;
          pCsr->nSegment = 0;
          pCsr->nAdvance = 0;
          local_d8 = (char *)(uVar30 & 0xffffffff);
          uVar25 = (long)local_d8 * 8;
          local_138 = pBVar12;
          iVar5 = sqlite3_initialize();
          __s = (Fts3SegReader **)0x0;
          if (iVar5 == 0) {
            __s = (Fts3SegReader **)sqlite3Malloc(uVar25);
          }
          pCsr->apSegment = __s;
          if (__s == (Fts3SegReader **)0x0) {
            iVar5 = 7;
          }
          else {
            memset(__s,0,uVar25);
            iVar5 = fts3SqlStmt(pFVar22,0xc,&pSelect,(sqlite3_value **)0x0);
          }
          psVar17 = pSelect;
          pBVar12 = local_138;
          if (iVar5 == 0) {
            local_128 = uVar30;
            sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_160);
            iVar5 = sqlite3_step(psVar17);
            bVar36 = true;
            iVar6 = 0;
            if ((iVar5 == 100) && (iVar6 = 0, (int)local_128 != 0)) {
              lVar35 = 0;
              pcVar31 = (char *)0x0;
              do {
                pMVar10 = columnMem(psVar17,1);
                local_168 = (int *)sqlite3VdbeIntValue(pMVar10);
                columnMallocFailure(psVar17);
                pMVar10 = columnMem(psVar17,2);
                local_170 = (char *)sqlite3VdbeIntValue(pMVar10);
                columnMallocFailure(psVar17);
                pMVar10 = columnMem(psVar17,3);
                in_R8 = (int *)sqlite3VdbeIntValue(pMVar10);
                columnMallocFailure(psVar17);
                pMVar10 = columnMem(psVar17,4);
                pcVar13 = (char *)sqlite3_value_blob(pMVar10);
                columnMallocFailure(psVar17);
                iVar5 = sqlite3_column_bytes(psVar17,4);
                piVar9 = local_150;
                iVar6 = sqlite3Fts3SegReaderNew
                                  ((int)pcVar31,0,(sqlite3_int64)local_168,(sqlite3_int64)local_170,
                                   (sqlite3_int64)in_R8,pcVar13,iVar5,
                                   (Fts3SegReader **)(*(long *)(local_150 + 0xb4) + lVar35));
                piVar9[0xb6] = piVar9[0xb6] + 1;
                bVar36 = iVar6 == 0;
                if ((!bVar36) || (iVar5 = sqlite3_step(psVar17), iVar5 != 100)) break;
                pcVar31 = pcVar31 + 1;
                lVar35 = lVar35 + 8;
              } while (pcVar31 < local_d8);
            }
            iVar5 = sqlite3_reset(psVar17);
            puVar19 = local_178;
            pFVar22 = local_180;
            uVar30 = local_128;
            piVar9 = local_150;
            pBVar12 = local_138;
            pCsr = local_d0;
            if (!bVar36) {
              iVar5 = iVar6;
            }
          }
        }
        local_18c = iVar5;
        if ((local_18c == 0) && (piVar9[0xb6] == (int)uVar30)) {
          *(int **)(piVar9 + 0xb8) = local_40;
          local_18c = fts3SegReaderStart(pFVar22,pCsr,*(char **)(piVar9 + 0xae),piVar9[0xb0]);
          if ((local_18c == 0) &&
             (local_18c = sqlite3Fts3SegReaderStep(pFVar22,pCsr), local_18c == 100)) {
            local_128 = uVar30;
            if ((char)local_130 == '\x01' && 0 < (int)pBVar12) {
              pvVar11 = *(void **)(piVar9 + 0xc2);
              iVar5 = piVar9[0xc4];
              _rc = (sqlite3_stmt *)0x0;
              iVar6 = fts3SqlStmt(pFVar22,0x20,(sqlite3_stmt **)&rc,(sqlite3_value **)0x0);
              psVar17 = _rc;
              aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
              if (iVar6 == 0) {
                uVar32 = (int)pBVar12 - 1;
                iEnd = 0;
                sqlite3_bind_int64(_rc,1,(sqlite_int64)(local_160 + 1));
                sqlite3_bind_int64(psVar17,2,(long)(int)uVar32);
                iVar6 = sqlite3_step(psVar17);
                if (iVar6 == 100) {
                  local_168 = (int *)CONCAT44(local_168._4_4_,100);
                  local_138 = (Blob *)(ulong)uVar32;
                  pMVar10 = columnMem(psVar17,1);
                  local_d8 = (char *)sqlite3VdbeIntValue(pMVar10);
                  columnMallocFailure(psVar17);
                  pMVar10 = columnMem(psVar17,2);
                  iVar14 = sqlite3VdbeIntValue(pMVar10);
                  columnMallocFailure(psVar17);
                  fts3ReadEndBlockField(psVar17,3,&iEnd,pnByte);
                  if (*pnByte < 0) {
                    *pnByte = -*pnByte;
                  }
                  *(bool *)(local_150 + 0xc) = *(long *)(local_150 + 10) == 0;
                  iVar6 = sqlite3_column_bytes(psVar17,4);
                  local_130 = CONCAT44(local_130._4_4_,iVar6);
                  pMVar10 = columnMem(psVar17,4);
                  local_170 = (char *)sqlite3_value_blob(pMVar10);
                  columnMallocFailure(psVar17);
                  sVar15 = iEnd;
                  pSelect = (sqlite3_stmt *)0x0;
                  bVar36 = false;
                  iVar6 = fts3SqlStmt(local_180,0x22,&pSelect,(sqlite3_value **)0x0);
                  psVar17 = pSelect;
                  if (iVar6 == 0) {
                    sqlite3_bind_int64(pSelect,1,sVar15);
                    iVar6 = sqlite3_step(psVar17);
                    bVar36 = iVar6 == 100;
                    iVar6 = sqlite3_reset(psVar17);
                  }
                  aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                  piVar9 = local_150;
                  if (iVar6 == 0 && bVar36) {
                    aLeaf = (char *)0x0;
                    nLeaf = 0;
                    iVar6 = sqlite3Fts3ReadBlock(local_180,iVar14,&aLeaf,&nLeaf,in_R8);
                    aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                    if (iVar6 == 0) {
                      iVar6 = nodeReaderInit((NodeReader *)&pSelect,aLeaf,nLeaf);
                      while ((pcVar31 = local_100, iVar6 == 0 && (pSelect != (sqlite3_stmt *)0x0)))
                      {
                        iVar6 = nodeReaderNext((NodeReader *)&pSelect);
                      }
                      aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                      iVar29 = iVar5 - local_f8;
                      iVar6 = local_f8;
                      if (iVar5 < local_f8) {
                        iVar6 = iVar5;
                      }
                      iVar5 = memcmp(pvVar11,local_100,(long)iVar6);
                      if (iVar5 != 0) {
                        iVar29 = iVar5;
                      }
                      if (iVar29 < 1) {
                        bVar36 = false;
                      }
                      sqlite3_free(pcVar31);
                    }
                    piVar9 = local_150;
                    sqlite3_free(aLeaf);
                  }
                  puVar19 = local_178;
                  if (((int)aBlock_1 == 0) && (bVar36)) {
                    cVar2 = *local_170;
                    uVar32 = (uint)cVar2;
                    iVar6 = (int)sVar15 - (int)local_d8;
                    iVar5 = iVar6 + 1;
                    iVar6 = iVar6 + 0x10;
                    if (-1 < iVar5) {
                      iVar6 = iVar5;
                    }
                    iVar6 = iVar6 >> 4;
                    lVar35 = (long)(int)uVar32;
                    *piVar9 = iVar6;
                    *(char **)(piVar9 + 6) = local_d8;
                    *(sqlite3_int64 *)(piVar9 + 8) = sVar15;
                    *(sqlite3_stmt **)(piVar9 + 2) = local_160;
                    piVar9[4] = (int)local_138;
                    if ((int)uVar32 < 0xf) {
                      lVar23 = lVar35 + -0xf;
                      puVar26 = (ulong *)(local_70 + lVar35 * 10);
                      in_R8 = (int *)(local_d8 + (lVar35 + 1) * (long)iVar6);
                      do {
                        *puVar26 = (ulong)in_R8;
                        puVar26 = puVar26 + 5;
                        in_R8 = (int *)((long)in_R8 + (long)iVar6);
                        lVar23 = lVar23 + 1;
                      } while (lVar23 != 0);
                    }
                    local_178[lVar35 * 5] = (ulong)(local_d8 + (int)(iVar6 * uVar32));
                    iVar6 = (int)local_130;
                    iVar5 = local_180->nNodeSize;
                    if (local_180->nNodeSize < (int)local_130) {
                      iVar5 = (int)local_130;
                    }
                    blobGrowBuffer((Blob *)(local_178 + lVar35 * 5 + 3),iVar5,(int *)&aBlock_1);
                    iVar5 = (int)aBlock_1;
                    if ((int)aBlock_1 == 0) {
                      memcpy((void *)puVar19[lVar35 * 5 + 3],local_170,(long)iVar6);
                      *(int *)(puVar19 + lVar35 * 5 + 4) = iVar6;
                    }
                    pFVar22 = local_180;
                    if (-1 < cVar2 && iVar5 == 0) {
                      uVar30 = (ulong)uVar32;
                      do {
                        puVar19 = local_178;
                        iVar5 = nodeReaderInit((NodeReader *)&pSelect,
                                               (char *)local_178[uVar30 * 5 + 3],
                                               (int)local_178[uVar30 * 5 + 4]);
                        while ((iVar6 = local_f8, pSelect != (sqlite3_stmt *)0x0 && (iVar5 == 0))) {
                          iVar5 = nodeReaderNext((NodeReader *)&pSelect);
                        }
                        aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar5);
                        blobGrowBuffer((Blob *)(puVar19 + uVar30 * 5 + 1),local_f8,(int *)&aBlock_1)
                        ;
                        if ((int)aBlock_1 == 0) {
                          memcpy((void *)puVar19[uVar30 * 5 + 1],local_100,(long)iVar6);
                          puVar26 = local_178;
                          *(int *)(puVar19 + uVar30 * 5 + 2) = iVar6;
                          if (0 < (long)uVar30) {
                            aLeaf = (char *)0x0;
                            nLeaf = 0;
                            local_178[uVar30 * 5 + -5] = local_108;
                            iVar5 = sqlite3Fts3ReadBlock(pFVar22,local_108,&aLeaf,&nLeaf,in_R8);
                            iVar6 = nLeaf;
                            aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar5);
                            iVar5 = pFVar22->nNodeSize;
                            if (iVar5 < nLeaf) {
                              iVar5 = nLeaf;
                            }
                            blobGrowBuffer((Blob *)(puVar26 + uVar30 * 5 + -2),iVar5,
                                           (int *)&aBlock_1);
                            if ((int)aBlock_1 == 0) {
                              memcpy((void *)puVar26[uVar30 * 5 + -2],aLeaf,(long)iVar6);
                              *(int *)(puVar26 + uVar30 * 5 + -1) = iVar6;
                            }
                            sqlite3_free(aLeaf);
                          }
                        }
                        sqlite3_free(local_100);
                        if ((long)uVar30 < 1) break;
                        uVar30 = uVar30 - 1;
                      } while ((int)aBlock_1 == 0);
                    }
                  }
                  iVar5 = sqlite3_reset(_rc);
                  if ((int)aBlock_1 != 0) {
                    iVar5 = (int)aBlock_1;
                  }
                  aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar5);
                  pCsr = local_d0;
                  iVar6 = (int)local_168;
                }
                else {
                  iVar5 = sqlite3_reset(psVar17);
                }
                puVar19 = local_178;
                pFVar22 = local_180;
                uVar30 = local_128;
                piVar9 = local_150;
                if (iVar6 != 100) goto LAB_001c394a;
              }
              pFVar22 = local_180;
              piVar9 = local_150;
              iVar5 = (int)aBlock_1;
            }
            else {
              iVar6 = 0;
              pSelect = (sqlite3_stmt *)0x0;
              _rc = (sqlite3_stmt *)0x0;
              local_138 = pBVar12;
              iVar5 = fts3SqlStmt(pFVar22,0x1d,&pSelect,(sqlite3_value **)0x0);
              psVar17 = pSelect;
              if (iVar5 == 0) {
                sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_160);
                sqlite3_bind_int64(psVar17,2,(long)piVar9[0xb6]);
                iVar5 = sqlite3_step(psVar17);
                iVar6 = 0;
                if (iVar5 == 100) {
                  pMVar10 = columnMem(psVar17,0);
                  iVar14 = sqlite3VdbeIntValue(pMVar10);
                  iVar6 = (int)iVar14;
                  columnMallocFailure(psVar17);
                }
                iVar5 = sqlite3_reset(psVar17);
              }
              puVar19 = local_178;
              if (iVar5 == 0) {
                iVar5 = fts3SqlStmt(pFVar22,10,(sqlite3_stmt **)&rc,(sqlite3_value **)0x0);
                psVar17 = _rc;
                if (iVar5 == 0) {
                  iVar5 = sqlite3_step(_rc);
                  if (iVar5 == 100) {
                    pMVar10 = columnMem(psVar17,0);
                    local_168 = (int *)sqlite3VdbeIntValue(pMVar10);
                    columnMallocFailure(psVar17);
                    *(int **)(piVar9 + 6) = local_168;
                    *(long *)(piVar9 + 8) = (long)local_168 + (long)(iVar6 << 4) + -1;
                  }
                  iVar5 = sqlite3_reset(psVar17);
                }
                puVar19 = local_178;
                if ((iVar5 == 0) &&
                   (iVar5 = fts3WriteSegment(pFVar22,*(sqlite3_int64 *)(piVar9 + 8),(char *)0x0,0),
                   puVar19 = local_178, iVar5 == 0)) {
                  *(sqlite3_stmt **)(piVar9 + 2) = local_160;
                  *piVar9 = iVar6;
                  piVar9[4] = (int)local_138;
                  lVar35 = *(long *)(piVar9 + 6);
                  lVar23 = 0x38;
                  do {
                    *(long *)((long)piVar9 + lVar23) = lVar35;
                    lVar23 = lVar23 + 0x28;
                    lVar35 = lVar35 + iVar6;
                  } while (lVar23 != 0x2b8);
                  iVar5 = 0;
                }
              }
            }
LAB_001c394a:
            if ((iVar5 == 0) && (local_18c = 0, *piVar9 != 0)) {
              do {
                piVar18 = local_150;
                pcVar31 = *(char **)(piVar9 + 0xc2);
                local_50 = *(int **)(piVar9 + 0xc6);
                iVar5 = piVar9[0xc4];
                local_130 = (ulong)iVar5;
                iVar6 = piVar9[200];
                piVar27 = (int *)(long)iVar6;
                _rc = (sqlite3_stmt *)((ulong)_rc & 0xffffffff00000000);
                uVar32 = piVar9[0x12];
                if ((int)uVar32 < 1) {
                  uVar34 = 0;
                }
                else {
                  uVar34 = 0;
                  do {
                    if (*(char *)(*(long *)(piVar9 + 0x10) + uVar34) != pcVar31[uVar34])
                    goto LAB_001c3b2e;
                    uVar34 = uVar34 + 1;
                  } while (uVar32 != uVar34);
                  uVar34 = (ulong)uVar32;
                }
LAB_001c3b2e:
                iVar33 = (int)uVar34;
                iVar29 = iVar5 + iVar6 + 2;
                uVar34 = (long)iVar33;
                iVar8 = iVar29 - iVar33;
                do {
                  iVar20 = iVar8;
                  bVar36 = 0x7f < uVar34;
                  uVar34 = uVar34 >> 7;
                  iVar8 = iVar20 + 1;
                } while (bVar36);
                uVar34 = (long)(iVar5 - iVar33);
                do {
                  iVar5 = iVar20;
                  bVar36 = 0x7f < uVar34;
                  piVar9 = piVar27;
                  uVar34 = uVar34 >> 7;
                  iVar20 = iVar5 + 1;
                } while (bVar36);
                do {
                  iVar5 = iVar5 + 1;
                  bVar36 = (int *)0x7f < piVar9;
                  piVar9 = (int *)((ulong)piVar9 >> 7);
                } while (bVar36);
                iVar8 = local_150[0x16];
                in_R8 = piVar27;
                if ((0 < iVar8) && (pFVar22->nNodeSize < iVar8 + iVar5)) {
                  iVar5 = fts3WriteSegment(pFVar22,*(sqlite3_int64 *)(local_150 + 0xe),
                                           *(char **)(local_150 + 0x14),iVar8);
                  _rc = (sqlite3_stmt *)CONCAT44(uStack_144,iVar5);
                  piVar9 = piVar18 + 1;
                  *piVar9 = *piVar9 + 1;
                  if (iVar5 == 0) {
                    uVar30 = *puVar19;
                    local_170 = (char *)CONCAT44(local_170._4_4_,iVar33 + 1);
                    local_78 = (size_t)(iVar33 + 1);
                    in_R8 = (int *)0x1;
                    do {
                      pSelect = (sqlite3_stmt *)((ulong)pSelect & 0xffffffff00000000);
                      uVar32 = (uint)puVar19[(long)in_R8 * 5 + 2];
                      if ((int)uVar32 < 1) {
                        uVar34 = 0;
                      }
                      else {
                        uVar34 = 0;
                        do {
                          if (*(char *)(puVar19[(long)in_R8 * 5 + 1] + uVar34) != pcVar31[uVar34])
                          goto LAB_001c3c3b;
                          uVar34 = uVar34 + 1;
                        } while (uVar32 != uVar34);
                        uVar34 = (ulong)uVar32;
                      }
LAB_001c3c3b:
                      puVar26 = puVar19 + (long)in_R8 * 5;
                      iVar8 = (int)uVar34;
                      uVar28 = (ulong)iVar8;
                      uVar34 = uVar28;
                      iVar5 = (iVar33 + 2) - iVar8;
                      do {
                        iVar20 = iVar5;
                        bVar36 = 0x7f < uVar34;
                        uVar34 = uVar34 >> 7;
                        iVar5 = iVar20 + 1;
                      } while (bVar36);
                      uVar24 = (ulong)((int)local_170 - iVar8);
                      uVar34 = uVar24;
                      do {
                        iVar20 = iVar20 + 1;
                        bVar36 = 0x7f < uVar34;
                        uVar34 = uVar34 >> 7;
                      } while (bVar36);
                      local_168 = in_R8;
                      if (((ulong)uVar32 == 0) || ((int)puVar26[4] + iVar20 <= local_180->nNodeSize)
                         ) {
                        pBVar12 = (Blob *)(puVar26 + 3);
                        local_138 = (Blob *)(puVar19 + (long)in_R8 * 5 + 1);
                        local_48 = uVar24;
                        if ((int)puVar26[4] == 0) {
                          local_60 = pBVar12;
                          blobGrowBuffer(pBVar12,local_180->nNodeSize,(int *)&pSelect);
                          pBVar12 = local_60;
                          if ((int)pSelect == 0) {
                            *local_60->a = (char)local_168;
                            pcVar13 = local_60->a;
                            lVar35 = 1;
                            do {
                              lVar23 = lVar35;
                              bVar4 = (byte)uVar30;
                              pcVar13[lVar23] = bVar4 | 0x80;
                              bVar36 = 0x7f < uVar30;
                              lVar35 = lVar23 + 1;
                              uVar30 = uVar30 >> 7;
                            } while (bVar36);
                            pcVar13[lVar23] = bVar4;
                            *(int *)(puVar26 + 4) = (int)(lVar23 + 1);
                          }
                        }
                        blobGrowBuffer(pBVar12,iVar20 + (int)puVar26[4],(int *)&pSelect);
                        blobGrowBuffer(local_138,(int)local_170,(int *)&pSelect);
                        uVar30 = local_48;
                        if ((int)pSelect == 0) {
                          if ((int)puVar26[2] != 0) {
                            lVar35 = (long)(int)puVar26[4] + puVar26[3];
                            lVar23 = 0;
                            uVar34 = uVar28;
                            do {
                              bVar4 = (byte)uVar34;
                              *(byte *)(lVar35 + lVar23) = bVar4 | 0x80;
                              lVar23 = lVar23 + 1;
                              bVar36 = 0x7f < uVar34;
                              uVar34 = uVar34 >> 7;
                            } while (bVar36);
                            *(byte *)(lVar35 + -1 + lVar23) = bVar4;
                            *(int *)(puVar26 + 4) = (int)puVar26[4] + (int)lVar23;
                          }
                          lVar23 = (long)(int)puVar26[4] + puVar26[3];
                          lVar35 = 0;
                          uVar34 = local_48;
                          do {
                            bVar4 = (byte)uVar34;
                            *(byte *)(lVar23 + lVar35) = bVar4 | 0x80;
                            lVar35 = lVar35 + 1;
                            bVar36 = 0x7f < uVar34;
                            uVar34 = uVar34 >> 7;
                          } while (bVar36);
                          *(byte *)(lVar23 + -1 + lVar35) = bVar4;
                          iVar5 = (int)lVar35 + (int)puVar26[4];
                          *(int *)(puVar26 + 4) = iVar5;
                          memcpy((void *)((long)iVar5 + puVar26[3]),pcVar31 + uVar28,local_48);
                          *(int *)(puVar26 + 4) = (int)puVar26[4] + (int)uVar30;
                          memcpy((void *)puVar26[1],pcVar31,local_78);
                          uVar30 = 0;
                          uVar7 = (int)local_170;
                          goto LAB_001c3eba;
                        }
                        uVar30 = 0;
                      }
                      else {
                        iVar5 = fts3WriteSegment(local_180,*puVar26,(char *)puVar26[3],
                                                 (int)puVar26[4]);
                        pSelect = (sqlite3_stmt *)CONCAT44(pSelect._4_4_,iVar5);
                        *(char *)puVar26[3] = (char)local_168;
                        uVar34 = puVar26[3];
                        lVar35 = 1;
                        uVar30 = uVar30 + 1;
                        do {
                          bVar4 = (byte)uVar30;
                          *(byte *)(uVar34 + lVar35) = bVar4 | 0x80;
                          lVar35 = lVar35 + 1;
                          bVar36 = 0x7f < uVar30;
                          uVar30 = uVar30 >> 7;
                        } while (bVar36);
                        *(byte *)((uVar34 - 1) + lVar35) = bVar4;
                        *(int *)(puVar26 + 4) = (int)lVar35;
                        uVar30 = *puVar26;
                        *puVar26 = uVar30 + 1;
                        uVar7 = 0;
LAB_001c3eba:
                        *(undefined4 *)(puVar26 + 2) = uVar7;
                      }
                      in_R8 = local_168;
                      iVar5 = (int)pSelect;
                      puVar19 = local_178;
                      if ((int)pSelect != 0 || uVar30 == 0) goto LAB_001c3f01;
                      in_R8 = (int *)((long)local_168 + 1);
                    } while (in_R8 != (int *)0x10);
                    iVar5 = 0;
LAB_001c3f01:
                    _rc = (sqlite3_stmt *)CONCAT44(uStack_144,iVar5);
                    piVar18 = local_150;
                    uVar30 = local_128;
                  }
                  *(long *)(piVar18 + 0xe) = *(long *)(piVar18 + 0xe) + 1;
                  piVar18[0x12] = 0;
                  piVar18[0x16] = 0;
                  uVar34 = local_130;
                  do {
                    iVar5 = iVar29;
                    bVar36 = 0x7f < uVar34;
                    uVar34 = uVar34 >> 7;
                    iVar29 = iVar5 + 1;
                  } while (bVar36);
                  do {
                    iVar5 = iVar5 + 1;
                    bVar36 = (int *)0x7f < piVar27;
                    piVar27 = (int *)((ulong)piVar27 >> 7);
                    pFVar22 = local_180;
                  } while (bVar36);
                }
                piVar9 = local_150;
                *(long *)(local_150 + 10) = *(long *)(local_150 + 10) + (long)iVar5;
                blobGrowBuffer(pBlob,iVar5 + local_150[0x16],&rc);
                if (rc == 0) {
                  if (piVar9[0x16] == 0) {
                    piVar9[0x16] = 1;
                    **(undefined1 **)(piVar9 + 0x14) = 0;
                  }
                  in_R8 = local_50;
                  iVar5 = fts3AppendToNode(pBlob,local_58,pcVar31,(int)local_130,(char *)local_50,
                                           iVar6);
                  _rc = (sqlite3_stmt *)CONCAT44(uStack_144,iVar5);
                }
                pCsr = local_d0;
                local_18c = rc;
                if (rc == 0) {
                  local_18c = sqlite3Fts3SegReaderStep(pFVar22,local_d0);
                }
                iVar5 = local_18c;
                if (local_18c == 100) {
                  iVar5 = 0;
                }
                if (piVar9[1] < local_bc) {
                  iVar5 = local_18c;
                }
                local_18c = iVar5;
              } while (iVar5 == 100);
              if (iVar5 != 0) goto LAB_001c3956;
              uVar32 = piVar9[1];
              uVar21 = piVar9[0xb6];
              local_18c = 0;
              if ((int)uVar21 < 1) {
                bVar36 = true;
                iVar6 = 0;
                local_168 = (int *)((ulong)local_168._4_4_ << 0x20);
              }
              else {
                local_168 = (int *)((ulong)local_168._4_4_ << 0x20);
                do {
                  pFVar22 = local_180;
                  pcVar31 = (char *)(ulong)uVar21;
                  uVar21 = uVar21 - 1;
                  if ((long)local_150[0xb6] < 1) {
                    pSeg = (Fts3SegReader *)0x0;
                  }
                  else {
                    uVar34 = 1;
                    do {
                      pSeg = pCsr->apSegment[uVar34 - 1];
                      if (pSeg->iIdx == uVar21) break;
                      bVar36 = uVar34 < (ulong)(long)local_150[0xb6];
                      uVar34 = uVar34 + 1;
                    } while (bVar36);
                  }
                  if (pSeg->aNode == (char *)0x0) {
                    local_170 = pcVar31;
                    iVar6 = fts3DeleteSegment(local_180,pSeg);
                    if (iVar6 == 0) {
                      iVar5 = pSeg->iIdx;
                      pSelect = (sqlite3_stmt *)0x0;
                      iVar6 = fts3SqlStmt(pFVar22,0x1e,&pSelect,(sqlite3_value **)0x0);
                      psVar17 = pSelect;
                      if (iVar6 == 0) {
                        sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_160);
                        sqlite3_bind_int64(psVar17,2,(long)iVar5);
                        sqlite3_step(psVar17);
                        iVar6 = sqlite3_reset(psVar17);
                      }
                    }
                    iVar5 = (int)local_170;
                    puVar19 = local_178;
                  }
                  else {
                    local_d8 = pSeg->zTerm;
                    uVar3 = pSeg->nTerm;
                    pBVar12 = (Blob *)(long)pSeg->iIdx;
                    pSelect = (sqlite3_stmt *)0x0;
                    uStack_110._0_4_ = 0;
                    uStack_110._4_4_ = 0;
                    _rc = (sqlite3_stmt *)0x0;
                    uStack_140._0_4_ = 0;
                    uStack_140._4_4_ = 0;
                    iEnd = 0;
                    aLeaf = (char *)0x0;
                    iVar6 = fts3SqlStmt(local_180,0x20,(sqlite3_stmt **)&aLeaf,(sqlite3_value **)0x0
                                       );
                    pcVar13 = aLeaf;
                    local_130 = 0;
                    if (iVar6 == 0) {
                      local_170 = pcVar31;
                      sqlite3_bind_int64((sqlite3_stmt *)aLeaf,1,(sqlite_int64)local_160);
                      sqlite3_bind_int64((sqlite3_stmt *)pcVar13,2,(sqlite_int64)pBVar12);
                      iVar5 = sqlite3_step((sqlite3_stmt *)pcVar13);
                      if (iVar5 == 100) {
                        pMVar10 = columnMem((sqlite3_stmt *)pcVar13,4);
                        pcVar31 = (char *)sqlite3_value_blob(pMVar10);
                        columnMallocFailure((sqlite3_stmt *)pcVar13);
                        iVar5 = sqlite3_column_bytes((sqlite3_stmt *)pcVar13,4);
                        pMVar10 = columnMem((sqlite3_stmt *)pcVar13,1);
                        local_130 = sqlite3VdbeIntValue(pMVar10);
                        columnMallocFailure((sqlite3_stmt *)pcVar13);
                        in_R8 = (int *)(ulong)uVar3;
                        iVar5 = fts3TruncateNode(pcVar31,iVar5,(Blob *)&pSelect,local_d8,uVar3,&iEnd
                                                );
                      }
                      else {
                        local_130 = 0;
                        iVar5 = 0;
                      }
                      iVar6 = sqlite3_reset((sqlite3_stmt *)pcVar13);
                      pcVar31 = local_170;
                      if (iVar5 != 0) {
                        iVar6 = iVar5;
                      }
                    }
                    pcVar13 = local_d8;
                    bVar36 = iVar6 == 0;
                    local_138 = pBVar12;
                    if (iEnd == 0 || !bVar36) {
                      sVar15 = 0;
                    }
                    else {
                      do {
                        sVar15 = iEnd;
                        aBlock_1 = (char *)0x0;
                        nLeaf = 0;
                        iVar6 = sqlite3Fts3ReadBlock(local_180,iEnd,&aBlock_1,&nLeaf,in_R8);
                        if (iVar6 == 0) {
                          in_R8 = (int *)(ulong)uVar3;
                          iVar6 = fts3TruncateNode(aBlock_1,nLeaf,(Blob *)&rc,pcVar13,uVar3,&iEnd);
                        }
                        if (iVar6 == 0) {
                          iVar6 = fts3WriteSegment(local_180,sVar15,(char *)_rc,(int)uStack_140);
                        }
                        sqlite3_free(aBlock_1);
                        bVar36 = iVar6 == 0;
                      } while ((bVar36) && (iEnd != 0));
                    }
                    uVar30 = local_128;
                    puVar19 = local_178;
                    if ((sVar15 != 0) && (bVar36)) {
                      aBlock_1 = (char *)0x0;
                      iVar6 = fts3SqlStmt(local_180,0x11,(sqlite3_stmt **)&aBlock_1,
                                          (sqlite3_value **)0x0);
                      pcVar13 = aBlock_1;
                      if (iVar6 == 0) {
                        sqlite3_bind_int64((sqlite3_stmt *)aBlock_1,1,local_130);
                        sqlite3_bind_int64((sqlite3_stmt *)pcVar13,2,sVar15 + -1);
                        sqlite3_step((sqlite3_stmt *)pcVar13);
                        iVar6 = sqlite3_reset((sqlite3_stmt *)pcVar13);
                      }
                    }
                    if (iVar6 == 0) {
                      aBlock_1 = (char *)0x0;
                      iVar6 = fts3SqlStmt(local_180,0x21,(sqlite3_stmt **)&aBlock_1,
                                          (sqlite3_value **)0x0);
                      pcVar13 = aBlock_1;
                      if (iVar6 == 0) {
                        local_170 = pcVar31;
                        sqlite3_bind_int64((sqlite3_stmt *)aBlock_1,1,sVar15);
                        in_R8 = (int *)0x0;
                        bindText((sqlite3_stmt *)pcVar13,2,pSelect,(int)uStack_110,
                                 (_func_void_void_ptr *)0x0,'\0');
                        sqlite3_bind_int64((sqlite3_stmt *)pcVar13,3,(sqlite_int64)local_160);
                        sqlite3_bind_int64((sqlite3_stmt *)pcVar13,4,(sqlite_int64)local_138);
                        sqlite3_step((sqlite3_stmt *)pcVar13);
                        iVar6 = sqlite3_reset((sqlite3_stmt *)pcVar13);
                        iVar5 = vdbeUnbind((Vdbe *)pcVar13,2);
                        pcVar31 = local_170;
                        if ((iVar5 == 0) &&
                           (*(sqlite3_mutex **)(*(long *)pcVar13 + 0x18) != (sqlite3_mutex *)0x0)) {
                          (*sqlite3Config.mutex.xMutexLeave)
                                    (*(sqlite3_mutex **)(*(long *)pcVar13 + 0x18));
                          pcVar31 = local_170;
                        }
                      }
                    }
                    iVar5 = (int)pcVar31;
                    sqlite3_free(pSelect);
                    sqlite3_free(_rc);
                    local_168 = (int *)CONCAT44(local_168._4_4_,(int)local_168 + 1);
                    pCsr = local_d0;
                  }
                  bVar36 = iVar6 == 0;
                } while ((1 < iVar5) && (iVar6 == 0));
              }
              pFVar22 = local_180;
              if (bVar36) {
                iVar6 = 0;
                if ((int)local_168 != local_150[0xb6]) {
                  uVar21 = 0;
                  pSelect = (sqlite3_stmt *)0x0;
                  _rc = (sqlite3_stmt *)0x0;
                  iVar6 = fts3SqlStmt(local_180,0x23,&pSelect,(sqlite3_value **)0x0);
                  psVar17 = pSelect;
                  pvVar11 = (void *)0x0;
                  if (iVar6 == 0) {
                    sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_160);
                    iVar5 = sqlite3_step(psVar17);
                    lVar35 = 0;
                    if (iVar5 == 100) {
                      iVar5 = 0;
                      pvVar11 = (void *)0x0;
                      iVar6 = 0;
                      do {
                        pvVar16 = pvVar11;
                        if (iVar6 <= lVar35) {
                          iVar6 = iVar6 + 0x10;
                          iVar29 = sqlite3_initialize();
                          if (iVar29 == 0) {
                            uVar25 = (u64)(uint)(iVar6 * 4);
                            if (iVar6 * 4 < 1) {
                              uVar25 = 0;
                            }
                            pvVar16 = sqlite3Realloc(pvVar11,uVar25);
                          }
                          else {
                            pvVar16 = (void *)0x0;
                          }
                          if (pvVar16 == (void *)0x0) {
                            iVar5 = 7;
                            break;
                          }
                        }
                        pvVar11 = pvVar16;
                        psVar17 = pSelect;
                        pMVar10 = columnMem(pSelect,0);
                        iVar14 = sqlite3VdbeIntValue(pMVar10);
                        columnMallocFailure(psVar17);
                        *(int *)((long)pvVar11 + lVar35 * 4) = (int)iVar14;
                        lVar35 = lVar35 + 1;
                        iVar29 = sqlite3_step(psVar17);
                      } while (iVar29 == 100);
                    }
                    else {
                      pvVar11 = (void *)0x0;
                      iVar5 = 0;
                    }
                    uVar21 = (uint)lVar35;
                    iVar6 = sqlite3_reset(pSelect);
                    pFVar22 = local_180;
                    if (iVar5 != 0) {
                      iVar6 = iVar5;
                    }
                  }
                  if (iVar6 == 0) {
                    iVar6 = fts3SqlStmt(pFVar22,0x1f,(sqlite3_stmt **)&rc,(sqlite3_value **)0x0);
                  }
                  if (iVar6 == 0) {
                    sqlite3_bind_int64(_rc,2,(sqlite_int64)local_160);
                  }
                  psVar17 = _rc;
                  pFVar22->bIgnoreSavepoint = '\x01';
                  if ((iVar6 == 0) && (uVar21 != 0)) {
                    uVar30 = 0;
                    do {
                      uVar3 = *(uint *)((long)pvVar11 + uVar30 * 4);
                      iVar6 = 0;
                      if (uVar30 != uVar3) {
                        sqlite3_bind_int64(psVar17,3,(long)(int)uVar3);
                        sqlite3_bind_int64(psVar17,1,uVar30);
                        sqlite3_step(psVar17);
                        iVar6 = sqlite3_reset(psVar17);
                      }
                    } while ((iVar6 == 0) && (uVar30 = uVar30 + 1, uVar30 < uVar21));
                  }
                  pFVar22->bIgnoreSavepoint = '\0';
                  sqlite3_free(pvVar11);
                  puVar19 = local_178;
                  uVar30 = local_128;
                  pCsr = local_d0;
                }
              }
              local_bc = local_bc + ~uVar32;
              iVar5 = (int)local_168;
              local_18c = iVar6;
              if ((int)local_168 != 0) {
                fts3IncrmergeHintPush(&hint,(i64)local_160,(int)local_168,&local_18c);
                iVar5 = 1;
                local_c0 = 1;
              }
              piVar9 = local_150;
            }
            else {
LAB_001c3956:
              local_18c = iVar5;
              iVar5 = (int)uVar30;
            }
            local_168 = (int *)CONCAT44(local_168._4_4_,iVar5);
            if (iVar5 != 0) {
              *(long *)(piVar9 + 10) = -*(long *)(piVar9 + 10);
            }
            pSelect = (sqlite3_stmt *)CONCAT44(pSelect._4_4_,local_18c);
            uVar34 = 0xf;
            do {
              uVar32 = (uint)uVar34;
              if (0 < (int)puVar19[uVar34 * 5 + 4]) goto LAB_001c39b1;
              sqlite3_free((void *)puVar19[uVar34 * 5 + 3]);
              pFVar22 = local_180;
              sqlite3_free((void *)puVar19[uVar34 * 5 + 1]);
              uVar34 = (ulong)(uVar32 - 1);
            } while (uVar32 != 0);
            uVar32 = 0xffffffff;
LAB_001c39b1:
            pBVar12 = pBlock;
            if (-1 < (int)uVar32) {
              if (uVar32 == 0) {
                blobGrowBuffer(pBlock,0xb,(int *)&pSelect);
                uVar32 = 1;
                if ((int)pSelect == 0) {
                  *pBVar12->a = '\x01';
                  pcVar31 = pBVar12->a;
                  lVar35 = 1;
                  uVar30 = *local_178;
                  do {
                    lVar23 = lVar35;
                    cVar2 = (char)uVar30;
                    in_R8 = (int *)(uVar30 & 0xffffffff | 0x80);
                    pcVar31[lVar23] = (char)in_R8;
                    bVar36 = 0x7f < uVar30;
                    lVar35 = lVar23 + 1;
                    uVar30 = uVar30 >> 7;
                  } while (bVar36);
                  pcVar31[lVar23] = cVar2;
                  piVar9[0x20] = (int)(lVar23 + 1);
                }
              }
              uVar21 = uVar32;
              if ((int)uVar32 < 2) {
                uVar21 = 1;
              }
              lVar35 = 0;
              iVar5 = (int)pSelect;
              do {
                iVar6 = *(int *)((long)piVar9 + lVar35 + 0x58);
                if ((0 < iVar6) && (iVar5 == 0)) {
                  iVar5 = fts3WriteSegment(pFVar22,*(sqlite3_int64 *)((long)piVar9 + lVar35 + 0x38),
                                           *(char **)((long)piVar9 + lVar35 + 0x50),iVar6);
                }
                sqlite3_free(*(void **)((long)piVar9 + lVar35 + 0x50));
                sqlite3_free(*(void **)((long)piVar9 + lVar35 + 0x40));
                pCsr = local_d0;
                uVar30 = local_128;
                puVar19 = local_178;
                lVar35 = lVar35 + 0x28;
              } while ((ulong)uVar21 * 0x28 != lVar35);
              pSelect = (sqlite3_stmt *)CONCAT44(pSelect._4_4_,iVar5);
              if (iVar5 == 0) {
                if ((char)piVar9[0xc] == '\0') {
                  sVar15 = *(sqlite3_int64 *)(piVar9 + 10);
                }
                else {
                  sVar15 = 0;
                }
                in_R8 = *(int **)(piVar9 + 0xe);
                iVar5 = fts3WriteSegdir(local_180,*(long *)(piVar9 + 2) + 1,piVar9[4],
                                        *(sqlite3_int64 *)(piVar9 + 6),(sqlite3_int64)in_R8,
                                        *(sqlite3_int64 *)(piVar9 + 8),sVar15,
                                        (char *)local_178[(ulong)uVar32 * 5 + 3],
                                        (int)local_178[(ulong)uVar32 * 5 + 4]);
                pSelect = (sqlite3_stmt *)CONCAT44(pSelect._4_4_,iVar5);
              }
              sqlite3_free((void *)puVar19[(ulong)uVar32 * 5 + 3]);
              sqlite3_free((void *)puVar19[(ulong)uVar32 * 5 + 1]);
              local_18c = (int)pSelect;
              pFVar22 = local_180;
            }
            if (((int)local_168 == 0) && ((char)piVar9[0xc] == '\0')) {
              fts3PromoteSegments(pFVar22,(sqlite3_int64)(local_160 + 1),
                                  *(sqlite3_int64 *)(piVar9 + 10));
            }
          }
        }
        sqlite3Fts3SegReaderFinish(pCsr);
      }
    } while (-1 < (int)uVar30);
    iVar5 = local_18c;
    if ((local_c0 != 0) && (local_18c == 0)) {
      pSelect = (sqlite3_stmt *)0x0;
      iVar5 = fts3SqlStmt(pFVar22,0x17,&pSelect,(sqlite3_value **)0x0);
      psVar17 = pSelect;
      if (iVar5 == 0) {
        sqlite3_bind_int64(pSelect,1,1);
        bindText(psVar17,2,hint.a,hint.n,(_func_void_void_ptr *)0x0,'\0');
        sqlite3_step(psVar17);
        iVar5 = sqlite3_reset(psVar17);
        iVar6 = vdbeUnbind((Vdbe *)psVar17,2);
        if ((iVar6 == 0) && (*(sqlite3_mutex **)(*(long *)psVar17 + 0x18) != (sqlite3_mutex *)0x0))
        {
          (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)psVar17 + 0x18));
        }
      }
    }
    local_18c = iVar5;
    sqlite3_free(piVar9);
    sqlite3_free(hint.a);
  }
  return local_18c;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3Incrmerge(Fts3Table *p, int nMerge, int nMin){
  int rc;                         /* Return code */
  int nRem = nMerge;              /* Number of leaf pages yet to  be written */
  Fts3MultiSegReader *pCsr;       /* Cursor used to read input data */
  Fts3SegFilter *pFilter;         /* Filter used with cursor pCsr */
  IncrmergeWriter *pWriter;       /* Writer object */
  int nSeg = 0;                   /* Number of input segments */
  sqlite3_int64 iAbsLevel = 0;    /* Absolute level number to work on */
  Blob hint = {0, 0, 0};          /* Hint read from %_stat table */
  int bDirtyHint = 0;             /* True if blob 'hint' has been modified */

  /* Allocate space for the cursor, filter and writer objects */
  const int nAlloc = sizeof(*pCsr) + sizeof(*pFilter) + sizeof(*pWriter);
  pWriter = (IncrmergeWriter *)sqlite3_malloc(nAlloc);
  if( !pWriter ) return SQLITE_NOMEM;
  pFilter = (Fts3SegFilter *)&pWriter[1];
  pCsr = (Fts3MultiSegReader *)&pFilter[1];

  rc = fts3IncrmergeHintLoad(p, &hint);
  while( rc==SQLITE_OK && nRem>0 ){
    const i64 nMod = FTS3_SEGDIR_MAXLEVEL * p->nIndex;
    sqlite3_stmt *pFindLevel = 0; /* SQL used to determine iAbsLevel */
    int bUseHint = 0;             /* True if attempting to append */
    int iIdx = 0;                 /* Largest idx in level (iAbsLevel+1) */

    /* Search the %_segdir table for the absolute level with the smallest
    ** relative level number that contains at least nMin segments, if any.
    ** If one is found, set iAbsLevel to the absolute level number and
    ** nSeg to nMin. If no level with at least nMin segments can be found, 
    ** set nSeg to -1.
    */
    rc = fts3SqlStmt(p, SQL_FIND_MERGE_LEVEL, &pFindLevel, 0);
    sqlite3_bind_int(pFindLevel, 1, MAX(2, nMin));
    if( sqlite3_step(pFindLevel)==SQLITE_ROW ){
      iAbsLevel = sqlite3_column_int64(pFindLevel, 0);
      nSeg = sqlite3_column_int(pFindLevel, 1);
      assert( nSeg>=2 );
    }else{
      nSeg = -1;
    }
    rc = sqlite3_reset(pFindLevel);

    /* If the hint read from the %_stat table is not empty, check if the
    ** last entry in it specifies a relative level smaller than or equal
    ** to the level identified by the block above (if any). If so, this 
    ** iteration of the loop will work on merging at the hinted level.
    */
    if( rc==SQLITE_OK && hint.n ){
      int nHint = hint.n;
      sqlite3_int64 iHintAbsLevel = 0;      /* Hint level */
      int nHintSeg = 0;                     /* Hint number of segments */

      rc = fts3IncrmergeHintPop(&hint, &iHintAbsLevel, &nHintSeg);
      if( nSeg<0 || (iAbsLevel % nMod) >= (iHintAbsLevel % nMod) ){
        iAbsLevel = iHintAbsLevel;
        nSeg = nHintSeg;
        bUseHint = 1;
        bDirtyHint = 1;
      }else{
        /* This undoes the effect of the HintPop() above - so that no entry
        ** is removed from the hint blob.  */
        hint.n = nHint;
      }
    }

    /* If nSeg is less that zero, then there is no level with at least
    ** nMin segments and no hint in the %_stat table. No work to do.
    ** Exit early in this case.  */
    if( nSeg<0 ) break;

    /* Open a cursor to iterate through the contents of the oldest nSeg 
    ** indexes of absolute level iAbsLevel. If this cursor is opened using 
    ** the 'hint' parameters, it is possible that there are less than nSeg
    ** segments available in level iAbsLevel. In this case, no work is
    ** done on iAbsLevel - fall through to the next iteration of the loop 
    ** to start work on some other level.  */
    memset(pWriter, 0, nAlloc);
    pFilter->flags = FTS3_SEGMENT_REQUIRE_POS;

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeOutputIdx(p, iAbsLevel, &iIdx);
      assert( bUseHint==1 || bUseHint==0 );
      if( iIdx==0 || (bUseHint && iIdx==1) ){
        int bIgnore = 0;
        rc = fts3SegmentIsMaxLevel(p, iAbsLevel+1, &bIgnore);
        if( bIgnore ){
          pFilter->flags |= FTS3_SEGMENT_IGNORE_EMPTY;
        }
      }
    }

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeCsr(p, iAbsLevel, nSeg, pCsr);
    }
    if( SQLITE_OK==rc && pCsr->nSegment==nSeg
     && SQLITE_OK==(rc = sqlite3Fts3SegReaderStart(p, pCsr, pFilter))
     && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pCsr))
    ){
      if( bUseHint && iIdx>0 ){
        const char *zKey = pCsr->zTerm;
        int nKey = pCsr->nTerm;
        rc = fts3IncrmergeLoad(p, iAbsLevel, iIdx-1, zKey, nKey, pWriter);
      }else{
        rc = fts3IncrmergeWriter(p, iAbsLevel, iIdx, pCsr, pWriter);
      }

      if( rc==SQLITE_OK && pWriter->nLeafEst ){
        fts3LogMerge(nSeg, iAbsLevel);
        do {
          rc = fts3IncrmergeAppend(p, pWriter, pCsr);
          if( rc==SQLITE_OK ) rc = sqlite3Fts3SegReaderStep(p, pCsr);
          if( pWriter->nWork>=nRem && rc==SQLITE_ROW ) rc = SQLITE_OK;
        }while( rc==SQLITE_ROW );

        /* Update or delete the input segments */
        if( rc==SQLITE_OK ){
          nRem -= (1 + pWriter->nWork);
          rc = fts3IncrmergeChomp(p, iAbsLevel, pCsr, &nSeg);
          if( nSeg!=0 ){
            bDirtyHint = 1;
            fts3IncrmergeHintPush(&hint, iAbsLevel, nSeg, &rc);
          }
        }
      }

      if( nSeg!=0 ){
        pWriter->nLeafData = pWriter->nLeafData * -1;
      }
      fts3IncrmergeRelease(p, pWriter, &rc);
      if( nSeg==0 && pWriter->bNoLeafData==0 ){
        fts3PromoteSegments(p, iAbsLevel+1, pWriter->nLeafData);
      }
    }

    sqlite3Fts3SegReaderFinish(pCsr);
  }

  /* Write the hint values into the %_stat table for the next incr-merger */
  if( bDirtyHint && rc==SQLITE_OK ){
    rc = fts3IncrmergeHintStore(p, &hint);
  }

  sqlite3_free(pWriter);
  sqlite3_free(hint.a);
  return rc;
}